

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O1

void usageMessage(ostream *stream,char *program_name,bool verbose)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"Usage: ",7);
  if (program_name == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar1 = strlen(program_name);
    std::__ostream_insert<char,std::char_traits<char>>(stream,program_name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,
             "-combine -i input.exr[:partnum][::partname] [input2.exr[:partnum]][::partname] [...] -o outfile.exr [options]\n"
             ,0x6e);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"  or: exrmultipart -separate -i infile.exr -o outfileBaseName [options]\n",0x48
            );
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"  or: exrmultipart -convert -i infile.exr -o outfile.exr [options]\n",0x43);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,
               "\nCombine or split multipart data\n\nOptions:\n  -override [0/1]   0 = do not override conflicting shared                         attributes [default]\n                    1 = override conflicting shared attributes\n  -view name        (after specifying -i) assign following inputs to view \'name\'\n  -h, --help        print this message\n\n      --version     print version information\n\nReport bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
               ,0x1e4);
    return;
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name << "-combine -i input.exr[:partnum][::partname] [input2.exr[:partnum]][::partname] [...] -o outfile.exr [options]\n";
    stream << "  or: exrmultipart -separate -i infile.exr -o outfileBaseName [options]\n";
    stream << "  or: exrmultipart -convert -i infile.exr -o outfile.exr [options]\n";       

    if (verbose)
        stream << "\n"
            "Combine or split multipart data\n"
            "\n"
            "Options:\n"
            "  -override [0/1]   0 = do not override conflicting shared "
            "                        attributes [default]\n"
            "                    1 = override conflicting shared attributes\n"
            "  -view name        (after specifying -i) assign following inputs to view 'name'\n"
            "  -h, --help        print this message\n"
            "\n"
            "      --version     print version information\n"
            "\n"
            "Report bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
            "";
}